

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O1

double double_conversion::StrtodTrimmed(Vector<const_char> trimmed,int exponent)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  undefined4 in_register_00000014;
  double *in_R8;
  uint64_t d64;
  double dVar6;
  long in_FS_OFFSET;
  Vector<const_char> trimmed_00;
  Vector<const_char> buffer;
  DiyFp diy_fp;
  double guess;
  double local_38;
  long local_30;
  
  trimmed_00._12_4_ = in_register_00000014;
  trimmed_00.length_ = exponent;
  trimmed_00.start_ = trimmed._8_8_;
  buffer.start_ = (double_conversion *)trimmed.start_;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = -NAN;
  bVar2 = ComputeGuess(buffer.start_,trimmed_00,(int)&local_38,in_R8);
  dVar1 = local_38;
  dVar6 = dVar1;
  if (!bVar2) {
    uVar4 = (long)local_38 * 2 & 0x1ffffffffffffe;
    bVar2 = ((ulong)local_38 & 0x7ff0000000000000) == 0;
    uVar5 = uVar4 + 0x20000000000000;
    if (bVar2) {
      uVar5 = uVar4;
    }
    uVar4 = 0xfffffbcd;
    if (!bVar2) {
      uVar4 = (ulong)(((uint)((ulong)local_38 >> 0x34) & 0x7ff) - 0x434);
    }
    diy_fp.f_ = uVar5 + 1;
    buffer._8_8_ = (ulong)trimmed_00.start_ & 0xffffffff;
    diy_fp._8_8_ = uVar4;
    iVar3 = CompareBufferWithDiyFp(buffer,exponent,diy_fp);
    if ((-1 < iVar3) && ((iVar3 != 0 || (((ulong)dVar1 & 1) != 0)))) {
      if (dVar1 == INFINITY) {
        dVar6 = INFINITY;
      }
      else if ((long)dVar1 < 0) {
        if ((dVar1 != 0.0) || (dVar6 = 0.0, NAN(dVar1))) {
          dVar6 = (double)((long)dVar1 + -1);
        }
      }
      else {
        dVar6 = (double)((long)dVar1 + 1);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return dVar6;
}

Assistant:

double StrtodTrimmed(Vector<const char> trimmed, int exponent) {
  DOUBLE_CONVERSION_ASSERT(trimmed.length() <= kMaxSignificantDecimalDigits);
  DOUBLE_CONVERSION_ASSERT(AssertTrimmedDigits(trimmed));
  double guess;
  const bool is_correct = ComputeGuess(trimmed, exponent, &guess);
  if (is_correct) {
    return guess;
  }
  DiyFp upper_boundary = Double(guess).UpperBoundary();
  int comparison = CompareBufferWithDiyFp(trimmed, exponent, upper_boundary);
  if (comparison < 0) {
    return guess;
  } else if (comparison > 0) {
    return Double(guess).NextDouble();
  } else if ((Double(guess).Significand() & 1) == 0) {
    // Round towards even.
    return guess;
  } else {
    return Double(guess).NextDouble();
  }
}